

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall glcts::StringStream::reset(StringStream *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::ios::clear((int)(this->super_ostringstream).
                       super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3] +
                  (int)this);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,fixed_sample_locations_values + 1,&local_31);
  std::__cxx11::stringbuf::str
            ((string *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void reset()
	{
		clear();
		str("");
	}